

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void getRadialGradientValues(RadialGradientValues *v,QSpanData *data)

{
  bool bVar1;
  long in_RSI;
  double *in_RDI;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffef;
  bool bVar2;
  
  *in_RDI = *(double *)(in_RSI + 0xb0) - *(double *)(in_RSI + 200);
  in_RDI[1] = *(double *)(in_RSI + 0xb8) - *(double *)(in_RSI + 0xd0);
  in_RDI[2] = *(double *)(in_RSI + 0xc0) - *(double *)(in_RSI + 0xd8);
  in_RDI[3] = *(double *)(in_RSI + 0xd8) * *(double *)(in_RSI + 0xd8);
  in_RDI[4] = -in_RDI[1] * in_RDI[1] + in_RDI[2] * in_RDI[2] + -(*in_RDI * *in_RDI);
  bVar1 = qFuzzyIsNull((double)CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8));
  bVar2 = true;
  if (bVar1) {
    bVar2 = in_RDI[4] <= 0.0;
  }
  *(bool *)(in_RDI + 5) = bVar2;
  return;
}

Assistant:

static void QT_FASTCALL getRadialGradientValues(RadialGradientValues *v, const QSpanData *data)
{
    v->dx = data->gradient.radial.center.x - data->gradient.radial.focal.x;
    v->dy = data->gradient.radial.center.y - data->gradient.radial.focal.y;

    v->dr = data->gradient.radial.center.radius - data->gradient.radial.focal.radius;
    v->sqrfr = data->gradient.radial.focal.radius * data->gradient.radial.focal.radius;

    v->a = v->dr * v->dr - v->dx*v->dx - v->dy*v->dy;

    v->extended = !qFuzzyIsNull(data->gradient.radial.focal.radius) || v->a <= 0;
}